

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O2

void ImGui::SameLine(float pos_x,float spacing_w)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  float fVar3;
  
  pIVar2 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  pIVar1->WriteAccessed = true;
  if (pIVar1->SkipItems == false) {
    if ((pos_x != 0.0) || (NAN(pos_x))) {
      fVar3 = 0.0;
      if (0.0 <= spacing_w) {
        fVar3 = spacing_w;
      }
      fVar3 = ((pIVar1->Pos).x - (pIVar1->Scroll).x) + pos_x + fVar3 + (pIVar1->DC).GroupOffset.x +
              (pIVar1->DC).ColumnsOffset.x;
    }
    else {
      if (spacing_w < 0.0) {
        spacing_w = (pIVar2->Style).ItemSpacing.x;
      }
      fVar3 = spacing_w + (pIVar1->DC).CursorPosPrevLine.x;
    }
    (pIVar1->DC).CursorPos.x = fVar3;
    (pIVar1->DC).CursorPos.y = (pIVar1->DC).CursorPosPrevLine.y;
    (pIVar1->DC).CurrentLineSize = (pIVar1->DC).PrevLineSize;
    (pIVar1->DC).CurrentLineTextBaseOffset = (pIVar1->DC).PrevLineTextBaseOffset;
  }
  return;
}

Assistant:

inline    ImGuiWindow*  GetCurrentWindow()          { ImGuiContext& g = *GImGui; g.CurrentWindow->WriteAccessed = true; return g.CurrentWindow; }